

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeXYZ.cpp
# Opt level: O3

void __thiscall chrono::ChNodeXYZ::ArchiveOUT(ChNodeXYZ *this)

{
  ChArchiveOut *in_RSI;
  
  ArchiveOUT((ChNodeXYZ *)
             ((long)(this->pos).m_data + *(long *)((long)this->super_ChLoadableUVW + -0xb8) + -8),
             in_RSI);
  return;
}

Assistant:

void ChNodeXYZ::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeXYZ>();

    // serialize parent class
    ChNodeBase::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(pos);
    marchive << CHNVP(pos_dt);
    marchive << CHNVP(pos_dtdt);
}